

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void save_dig_status(memfile *mf)

{
  mfmagic_set(mf,0x53474944);
  mwrite32(mf,digging.effort);
  mwrite32(mf,digging.lastdigtime);
  mwrite8(mf,digging.level.dnum);
  mwrite8(mf,digging.level.dlevel);
  mwrite8(mf,digging.pos.x);
  mwrite8(mf,digging.pos.y);
  mwrite8(mf,digging.down);
  mwrite8(mf,digging.chew);
  mwrite8(mf,digging.warned);
  mwrite8(mf,digging.quiet);
  return;
}

Assistant:

void save_dig_status(struct memfile *mf)
{
    /* no mtag useful; fixed distance after steal status */
    mfmagic_set(mf, DIG_MAGIC);
    mwrite32(mf, digging.effort);
    mwrite32(mf, digging.lastdigtime);
    mwrite8(mf, digging.level.dnum);
    mwrite8(mf, digging.level.dlevel);
    mwrite8(mf, digging.pos.x);
    mwrite8(mf, digging.pos.y);
    mwrite8(mf, digging.down);
    mwrite8(mf, digging.chew);
    mwrite8(mf, digging.warned);
    mwrite8(mf, digging.quiet);
}